

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

void __thiscall date_parse_result::def_date(date_parse_result *this,int32_t dayno)

{
  multicaldate_t *pmVar1;
  int iVar2;
  
  (*this->cal->_vptr_multicaldate_t[3])();
  iVar2 = this->era;
  if (iVar2 == 0) goto LAB_00290c0e;
  if (iVar2 == -2) {
    this->yy = 1 - this->yy;
  }
  else {
    if (iVar2 == -1) {
      this->yy = -this->yy;
      goto LAB_00290c0e;
    }
    if (iVar2 != 2) goto LAB_00290c0e;
  }
  this->yy_needs_century = 0;
LAB_00290c0e:
  pmVar1 = this->cal;
  if (this->yy_needs_century != 0) {
    iVar2 = (pmVar1->y_ / 100) * 100 + this->yy;
    this->yy = iVar2;
    if (iVar2 < pmVar1->y_ + -0x32) {
      this->yy = iVar2 + 100;
    }
    if (pmVar1->y_ + 0x31 < this->yy) {
      this->yy = this->yy + -100;
    }
  }
  return;
}

Assistant:

void def_date(int32_t dayno)
    {
        /* convert the day number to a calendar date */
        cal->set_dayno(dayno);

        /* apply the era to the year, if both are present */
        if (era != 0 && has_year())
        {
            switch (era)
            {
            case 1:
                /* 
                 *   astronomical '+' notation - the internal year number
                 *   matches the nominal year 
                 */
                break;
                
            case 2:
                /* 
                 *   AD - the internal year matches the nominal year, but an
                 *   explicit AD overrides the need for a century; e.g., AD
                 *   87 is pretty clear that we're talking about an
                 *   historical date in the first century 
                 */
                yy_needs_century = FALSE;
                break;
                
            case -1:
                /* 
                 *   astronomical '-' notation - the internal year number
                 *   matches the nominal negative year number, since we use
                 *   the same notation internally
                 */
                yy = -yy;
                break;
                
            case -2:
                /* BC - 1 BC is internal year 0, 2 BC is year -1, etc */
                yy = -yy + 1;
                yy_needs_century = FALSE;
                break;
            }
        }

        /* set the default year, month, and day from the given date */
        def_year(cal->y());
        def_month(cal->m());
        def_day(cal->d());

        /* 
         *   If the year was specified without a century, choose the century
         *   such that it yields the year nearest to the current year.  This
         *   is equivalent to finding the year within 50 years of the current
         *   year.  For 2012, this makes the range 1962 to 2061 - so '62 is
         *   taken to be 1962, '85 is 1985, but '15 is 2015, and 61 is 2061.
         */
        if (yy_needs_century)
        {
            yy += ((cal->y() / 100) * 100);
            if (yy < cal->y() - 50)
                yy += 100;
            if (yy > cal->y() + 49)
                yy -= 100;
        }
    }